

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::BothInclusiveBetweenOperator,false,true,false>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  sel_t *psVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  
  if (count == 0) {
    iVar10 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    puVar5 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar6 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar7 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    psVar8 = true_sel->sel_vector;
    iVar10 = 0;
    uVar15 = 0;
    do {
      uVar13 = uVar15;
      if (psVar1 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar1[uVar15];
      }
      uVar9 = uVar15;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar15];
      }
      uVar11 = uVar15;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar15];
      }
      uVar17 = uVar15;
      if (psVar4 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar4[uVar15];
      }
      if ((((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0))
          && ((puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)
              ))) &&
         ((puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0))))
      {
        lVar16._0_4_ = adata[uVar9].months;
        lVar16._4_4_ = adata[uVar9].days;
        lVar14._0_4_ = bdata[uVar11].months;
        lVar14._4_4_ = bdata[uVar11].days;
        lVar12 = (lVar14 >> 0x20) + bdata[uVar11].micros / 86400000000;
        lVar19 = lVar12 % 0x1e;
        lVar20 = (long)(int)(undefined4)lVar14 + lVar12 / 0x1e;
        lVar12 = (lVar16 >> 0x20) + adata[uVar9].micros / 86400000000;
        lVar14 = adata[uVar9].micros % 86400000000;
        lVar18 = lVar12 % 0x1e;
        lVar16 = (long)(int)(undefined4)lVar16 + lVar12 / 0x1e;
        if (lVar16 < lVar20) {
          uVar9 = 0;
        }
        else {
          lVar12._0_4_ = cdata[uVar17].months;
          lVar12._4_4_ = cdata[uVar17].days;
          if ((lVar20 < lVar16) ||
             ((lVar19 <= lVar18 &&
              ((lVar19 < lVar18 || (bdata[uVar11].micros % 86400000000 <= lVar14)))))) {
            lVar19 = (lVar12 >> 0x20) + cdata[uVar17].micros / 86400000000;
            lVar20 = lVar19 % 0x1e;
            lVar12 = (long)(int)(undefined4)lVar12 + lVar19 / 0x1e;
            if (lVar16 <= lVar12) {
              uVar9 = 1;
              if (lVar12 <= lVar16) {
                if (lVar20 < lVar18) goto LAB_003d2437;
                uVar9 = (ulong)(lVar14 <= cdata[uVar17].micros % 86400000000 || lVar18 < lVar20);
              }
              goto LAB_003d246a;
            }
          }
          uVar9 = 0;
        }
      }
      else {
LAB_003d2437:
        uVar9 = 0;
      }
LAB_003d246a:
      psVar8[iVar10] = (sel_t)uVar13;
      iVar10 = uVar9 + iVar10;
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  return iVar10;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}